

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

void mh_free(AD *ad)

{
  Integer handle;
  
  handle = ma_table_lookup_assoc((TableData)ad);
  if (handle != -1) {
    ma_table_deallocate(handle);
    return;
  }
  sprintf(ma_ebuf,"cannot find memhandle for block address 0x%lx",ad);
  ma_error(EL_Nonfatal,ET_Internal,"mh_free",ma_ebuf);
  return;
}

Assistant:

private void mh_free(ad)
    AD        *ad;        /* the AD whose memhandle to free */
{
    Integer    memhandle;    /* memhandle for AD */

    /* convert AD to memhandle */
    if ((memhandle = ma_table_lookup_assoc((TableData)ad)) == TABLE_HANDLE_NONE)
    {
        (void)sprintf(ma_ebuf,
            "cannot find memhandle for block address 0x%lx",
            (size_t)ad);
        ma_error(EL_Nonfatal, ET_Internal, "mh_free", ma_ebuf);
    }
    else
        /* free memhandle */
        ma_table_deallocate(memhandle);
}